

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CCEXP.hpp
# Opt level: O2

void CCEXP::LoadTable<float>(CCEXP *obj,char *name,char *type)

{
  FILE *__stream;
  ulong new_elements_;
  CCEXP *pCVar1;
  int iVar2;
  CCEXPBase *__p;
  size_t sVar3;
  ulong uVar4;
  CCEXPMat<float> *this;
  long lVar5;
  uint uVar6;
  char *pcVar7;
  uint64_t i;
  uint64_t new_elements__00;
  uint64_t MaxRows_00;
  uint64_t N;
  CCEXP *local_170;
  long local_168;
  uint64_t MaxRows;
  uint64_t typeSize;
  char *local_150;
  MVECTOR<unsigned_long> DPL;
  __shared_ptr<CCEXP::CCEXPBase,(__gnu_cxx::_Lock_policy)2> local_108 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_100;
  MVECTOR<float> rowData;
  char loadType [64];
  char loadName [64];
  
  obj->ErrorId = 0;
  if (obj->isActive != true) {
    return;
  }
  uVar6 = obj->Status;
  obj->Status = 2;
  if (uVar6 < 2) {
    __stream = (FILE *)obj->lfp;
    if (__stream != (FILE *)0x0) {
      loadName[0x30] = '\0';
      loadName[0x31] = '\0';
      loadName[0x32] = '\0';
      loadName[0x33] = '\0';
      loadName[0x34] = '\0';
      loadName[0x35] = '\0';
      loadName[0x36] = '\0';
      loadName[0x37] = '\0';
      loadName[0x38] = '\0';
      loadName[0x39] = '\0';
      loadName[0x3a] = '\0';
      loadName[0x3b] = '\0';
      loadName[0x3c] = '\0';
      loadName[0x3d] = '\0';
      loadName[0x3e] = '\0';
      loadName[0x3f] = '\0';
      loadName[0x20] = '\0';
      loadName[0x21] = '\0';
      loadName[0x22] = '\0';
      loadName[0x23] = '\0';
      loadName[0x24] = '\0';
      loadName[0x25] = '\0';
      loadName[0x26] = '\0';
      loadName[0x27] = '\0';
      loadName[0x28] = '\0';
      loadName[0x29] = '\0';
      loadName[0x2a] = '\0';
      loadName[0x2b] = '\0';
      loadName[0x2c] = '\0';
      loadName[0x2d] = '\0';
      loadName[0x2e] = '\0';
      loadName[0x2f] = '\0';
      loadName[0x10] = '\0';
      loadName[0x11] = '\0';
      loadName[0x12] = '\0';
      loadName[0x13] = '\0';
      loadName[0x14] = '\0';
      loadName[0x15] = '\0';
      loadName[0x16] = '\0';
      loadName[0x17] = '\0';
      loadName[0x18] = '\0';
      loadName[0x19] = '\0';
      loadName[0x1a] = '\0';
      loadName[0x1b] = '\0';
      loadName[0x1c] = '\0';
      loadName[0x1d] = '\0';
      loadName[0x1e] = '\0';
      loadName[0x1f] = '\0';
      loadName[0] = '\0';
      loadName[1] = '\0';
      loadName[2] = '\0';
      loadName[3] = '\0';
      loadName[4] = '\0';
      loadName[5] = '\0';
      loadName[6] = '\0';
      loadName[7] = '\0';
      loadName[8] = '\0';
      loadName[9] = '\0';
      loadName[10] = '\0';
      loadName[0xb] = '\0';
      loadName[0xc] = '\0';
      loadName[0xd] = '\0';
      loadName[0xe] = '\0';
      loadName[0xf] = '\0';
      loadType[0x30] = '\0';
      loadType[0x31] = '\0';
      loadType[0x32] = '\0';
      loadType[0x33] = '\0';
      loadType[0x34] = '\0';
      loadType[0x35] = '\0';
      loadType[0x36] = '\0';
      loadType[0x37] = '\0';
      loadType[0x38] = '\0';
      loadType[0x39] = '\0';
      loadType[0x3a] = '\0';
      loadType[0x3b] = '\0';
      loadType[0x3c] = '\0';
      loadType[0x3d] = '\0';
      loadType[0x3e] = '\0';
      loadType[0x3f] = '\0';
      loadType[0x20] = '\0';
      loadType[0x21] = '\0';
      loadType[0x22] = '\0';
      loadType[0x23] = '\0';
      loadType[0x24] = '\0';
      loadType[0x25] = '\0';
      loadType[0x26] = '\0';
      loadType[0x27] = '\0';
      loadType[0x28] = '\0';
      loadType[0x29] = '\0';
      loadType[0x2a] = '\0';
      loadType[0x2b] = '\0';
      loadType[0x2c] = '\0';
      loadType[0x2d] = '\0';
      loadType[0x2e] = '\0';
      loadType[0x2f] = '\0';
      loadType[0x10] = '\0';
      loadType[0x11] = '\0';
      loadType[0x12] = '\0';
      loadType[0x13] = '\0';
      loadType[0x14] = '\0';
      loadType[0x15] = '\0';
      loadType[0x16] = '\0';
      loadType[0x17] = '\0';
      loadType[0x18] = '\0';
      loadType[0x19] = '\0';
      loadType[0x1a] = '\0';
      loadType[0x1b] = '\0';
      loadType[0x1c] = '\0';
      loadType[0x1d] = '\0';
      loadType[0x1e] = '\0';
      loadType[0x1f] = '\0';
      typeSize = 0;
      N = 0;
      MaxRows = 0;
      loadType[0] = '\0';
      loadType[1] = '\0';
      loadType[2] = '\0';
      loadType[3] = '\0';
      loadType[4] = '\0';
      loadType[5] = '\0';
      loadType[6] = '\0';
      loadType[7] = '\0';
      loadType[8] = '\0';
      loadType[9] = '\0';
      loadType[10] = '\0';
      loadType[0xb] = '\0';
      loadType[0xc] = '\0';
      loadType[0xd] = '\0';
      loadType[0xe] = '\0';
      loadType[0xf] = '\0';
      uVar4 = obj->LoadTableIndex;
      local_168 = 0;
      local_170 = obj;
      local_150 = type;
      for (; uVar4 < obj->LoadTotalTables; uVar4 = uVar4 + 1) {
        local_168 = ftell(__stream);
        fread(loadName,1,0x40,__stream);
        fread(loadType,1,0x40,__stream);
        fread(&typeSize,8,1,__stream);
        fread(&N,8,1,__stream);
        fread(&MaxRows,8,1,__stream);
        MaxRows_00 = MaxRows;
        new_elements__00 = N;
        if (MaxRows <= N) {
          new_elements__00 = MaxRows;
        }
        N = new_elements__00;
        iVar2 = strcmp(loadName,name);
        if (iVar2 == 0) goto LAB_0011d379;
        ns_MVECTOR::MVECTOR<unsigned_long>::MVECTOR(&DPL);
        ns_MVECTOR::MVECTOR<unsigned_long>::resize(&DPL,new_elements__00);
        fread(DPL.pdata,8,new_elements__00,__stream);
        obj = local_170;
        lVar5 = 0;
        for (sVar3 = 0; new_elements__00 != sVar3; sVar3 = sVar3 + 1) {
          lVar5 = lVar5 + DPL.pdata[sVar3] * typeSize;
        }
        fseek(__stream,lVar5,1);
        ns_MVECTOR::MVECTOR<unsigned_long>::~MVECTOR(&DPL);
      }
      fseek(__stream,0xc,0);
      for (uVar4 = 0; uVar4 < obj->LoadTableIndex; uVar4 = uVar4 + 1) {
        local_168 = ftell(__stream);
        fread(loadName,1,0x40,__stream);
        fread(loadType,1,0x40,__stream);
        fread(&typeSize,8,1,__stream);
        fread(&N,8,1,__stream);
        fread(&MaxRows,8,1,__stream);
        MaxRows_00 = MaxRows;
        new_elements__00 = N;
        if (MaxRows <= N) {
          new_elements__00 = MaxRows;
        }
        N = new_elements__00;
        iVar2 = strcmp(loadName,name);
        if (iVar2 == 0) goto LAB_0011d379;
        ns_MVECTOR::MVECTOR<unsigned_long>::MVECTOR(&DPL);
        ns_MVECTOR::MVECTOR<unsigned_long>::resize(&DPL,new_elements__00);
        fread(DPL.pdata,8,new_elements__00,__stream);
        obj = local_170;
        lVar5 = 0;
        for (sVar3 = 0; new_elements__00 != sVar3; sVar3 = sVar3 + 1) {
          lVar5 = lVar5 + DPL.pdata[sVar3] * typeSize;
        }
        fseek(__stream,lVar5,1);
        ns_MVECTOR::MVECTOR<unsigned_long>::~MVECTOR(&DPL);
      }
      fseek(__stream,local_168,0);
      pcVar7 = "[%s]: LoadTable():: Failed to find table [%s] into the last opened file!";
      uVar6 = 0x252;
      goto LAB_0011d537;
    }
    pcVar7 = "[%s]: LoadTable():: File pointer is NULL. Use CCEXP::Open() first!";
    uVar6 = 0x21c;
  }
  else {
    pcVar7 = "[%s]: LoadTable():: CCEXP object has wrong status!";
    uVar6 = 0x21a;
  }
  CECS::RecError((CECS *)CCEXPECS,-9999,1,"CCEXP.hpp",uVar6,pcVar7,obj->SavingFile);
  return;
LAB_0011d379:
  pcVar7 = local_150;
  obj = local_170;
  local_170->LoadTableIndex = uVar4 + 1;
  iVar2 = strcmp(loadType,local_150);
  if (iVar2 != 0) {
    fseek(__stream,local_168,0);
    CECS::RecError((CECS *)CCEXPECS,-9999,1,"CCEXP.hpp",600,
                   "[%s]: LoadTable():: Table [%s] is of \"%s\" type, while requested LoadTable is of \"%s\" type!"
                   ,obj->SavingFile,name,loadType,pcVar7);
    return;
  }
  sVar3 = CCEXP::checkDuplicatedNames(obj,name);
  if (sVar3 == 0) {
    __p = (CCEXPBase *)operator_new(0xb8);
    __p->_vptr_CCEXPBase = (_func_int **)&PTR__CCEXPMat_00130948;
    *(undefined2 *)((long)&__p[0x11]._vptr_CCEXPBase + 2) = 0x100;
    __p[0x14]._vptr_CCEXPBase = (_func_int **)0x0;
    __p[0x12]._vptr_CCEXPBase = (_func_int **)0x0;
    __p[0x13]._vptr_CCEXPBase = (_func_int **)0x0;
    __p[0x15]._vptr_CCEXPBase = (_func_int **)0xffffffffffffffff;
    std::__shared_ptr<CCEXP::CCEXPBase,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<CCEXP::CCEXPBase,void>(local_108,__p);
    ns_MVECTOR::MVECTOR<std::shared_ptr<CCEXP::CCEXPBase>_>::push_back
              (&obj->M,(shared_ptr<CCEXP::CCEXPBase> *)local_108);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_100);
    this = (CCEXPMat<float> *)
           (obj->M).pdata[(obj->M).elements - 1].
           super___shared_ptr<CCEXP::CCEXPBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  else {
    sVar3 = CCEXP::getTableIndexByName(obj,name);
    this = (CCEXPMat<float> *)
           (obj->M).pdata[sVar3].super___shared_ptr<CCEXP::CCEXPBase,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
    (*(this->super_CCEXPBase)._vptr_CCEXPBase[0xf])(this);
  }
  iVar2 = CCEXPMat<float>::Initialize(this,loadName,loadType,MaxRows_00,obj);
  if (iVar2 == 0) {
    ns_MVECTOR::MVECTOR<unsigned_long>::MVECTOR(&DPL);
    ns_MVECTOR::MVECTOR<unsigned_long>::resize(&DPL,new_elements__00);
    fread(DPL.pdata,8,new_elements__00,__stream);
    ns_MVECTOR::MVECTOR<float>::MVECTOR(&rowData);
    uVar4 = 0;
    sVar3 = 0;
    do {
      if (new_elements__00 == sVar3) {
        (*(this->super_CCEXPBase)._vptr_CCEXPBase[6])(this);
        pCVar1 = local_170;
        if (local_170->LoadTotalTables <= local_170->LoadTableIndex) {
          local_170->LoadTableIndex = 0;
          fseek(__stream,0xc,0);
        }
        pCVar1->Status = 1;
LAB_0011d65f:
        ns_MVECTOR::MVECTOR<float>::~MVECTOR(&rowData);
        ns_MVECTOR::MVECTOR<unsigned_long>::~MVECTOR(&DPL);
        return;
      }
      new_elements_ = DPL.pdata[sVar3];
      if (uVar4 < new_elements_) {
        ns_MVECTOR::MVECTOR<float>::resize(&rowData,new_elements_);
        uVar4 = new_elements_;
      }
      fread(rowData.pdata,4,new_elements_,__stream);
      iVar2 = CCEXPMat<float>::AddRow(this,rowData.pdata,new_elements_);
      if (iVar2 != 0) {
        CECS::RecError((CECS *)CCEXPECS,-9999,1,"CCEXP.hpp",0x273,
                       "[%s]: LoadTable():: Internal error occured while copying Table\'s [%s], row [%zu] from an opened file!"
                       ,local_170->SavingFile,name,sVar3);
        goto LAB_0011d65f;
      }
      sVar3 = sVar3 + 1;
    } while( true );
  }
  pcVar7 = 
  "[%s]: LoadTable():: Internal error occured while copying Table [%s] from an opened file!";
  uVar6 = 0x268;
LAB_0011d537:
  CECS::RecError((CECS *)CCEXPECS,-9999,1,"CCEXP.hpp",uVar6,pcVar7,obj->SavingFile,name);
  return;
}

Assistant:

inline void LoadTable(CCEXP &obj, const char* name, const char* type) {
	obj.ErrorId = 0;
	if (!obj.isActive) return;
	int prevStatus = obj.Status;
	// If any error occurs, then it should be critical error!
	obj.Status = CCEXPORTMAT_ACTIVE;
	CECS_ERR(CCEXPECS,(prevStatus != CCEXPORTMAT_INIT) && (prevStatus != CCEXPORTMAT_READY),"[%s]: LoadTable():: CCEXP object has wrong status!", obj.SavingFile);
	FILE* lfp = obj.lfp;
	CECS_ERR(CCEXPECS,lfp == NULL,"[%s]: LoadTable():: File pointer is NULL. Use CCEXP::Open() first!", obj.SavingFile);
	char loadName[64]={0};
	char loadType[64]={0};
	uint64_t typeSize=0;
	uint64_t N=0;
	uint64_t LastTablePosByte = 0;
	uint64_t MaxRows=0;
	bool TableFound = false;
	// Search from current LoadTableIndex to the Total Tables of files.
	for (uint64_t i = obj.LoadTableIndex; i < obj.LoadTotalTables; i++) {
		LastTablePosByte = ftell(lfp);
		fread(loadName,sizeof(char),64,lfp);
		fread(loadType,sizeof(char),64,lfp);
		fread(&typeSize,sizeof(uint64_t),1,lfp);
		fread(&N,sizeof(uint64_t),1,lfp);
		fread(&MaxRows,sizeof(uint64_t),1,lfp);
		if (N > MaxRows) N = MaxRows;
		if (strcmp(loadName,name)==0) {
			TableFound = true; obj.LoadTableIndex = i+1; break;
		}
		MVECTOR<uint64_t> DPL; DPL.resize(N);
		fread(DPL.data(), sizeof(uint64_t), N, lfp);
		uint64_t TableBytes = 0;
		for (uint64_t c = 0; c < N; c++)
			TableBytes += DPL[c]*typeSize;
		fseek(lfp, (long)TableBytes, SEEK_CUR);
	}
	if (!TableFound) {
		// If the Table has not been found in the file, search again from the start
		fseek(lfp, sizeof(uint32_t) + sizeof(uint64_t), SEEK_SET);

		for (uint64_t i = 0; i < obj.LoadTableIndex; i++) {
			LastTablePosByte = ftell(lfp);
			fread(loadName,sizeof(char),64,lfp);
			fread(loadType,sizeof(char),64,lfp);
			fread(&typeSize,sizeof(uint64_t),1,lfp);
			fread(&N,sizeof(uint64_t),1,lfp);
			fread(&MaxRows,sizeof(uint64_t),1,lfp);
			if (N > MaxRows) N = MaxRows;
			if (strcmp(loadName,name)==0) {
				TableFound = true; obj.LoadTableIndex = i+1; break;
			}
			MVECTOR<uint64_t> DPL; DPL.resize(N);
			fread(DPL.data(), sizeof(uint64_t), N, lfp);
			uint64_t TableBytes = 0;
			for (uint64_t c = 0; c < N; c++)
				TableBytes += DPL[c]*typeSize;
			fseek(lfp, (long)TableBytes, SEEK_CUR);
		}
	}

	// If the Table hot not been found, then abort with error.
	if(!TableFound) {
		fseek(lfp, (long)LastTablePosByte, SEEK_SET);
		CECS_ERR(CCEXPECS,1, "[%s]: LoadTable():: Failed to find table [%s] into the last opened file!", obj.SavingFile, name);
	}

	// At this point the table has been found, and we have to reload it!
	if (strcmp(loadType, type) != 0) {
		fseek(lfp, (long)LastTablePosByte, SEEK_SET);
		CECS_ERR(CCEXPECS,1,"[%s]: LoadTable():: Table [%s] is of \"%s\" type, while requested LoadTable is of \"%s\" type!", obj.SavingFile, name, loadType, type);
	}

	CCEXPMat<T> *U;
	if (obj.checkDuplicatedNames(name) > 0) { // If the table already exist!
		size_t idx = obj.getTableIndexByName(name);
		U = static_cast<CCEXPMat<T>*>(obj.M[idx].get());
		U->Reset();
	}
	else
	{// If the table does not exist create a new Table...
		obj.M.push_back(shared_ptr<CCEXPBase>((CCEXPBase*) new CCEXPMat<T>));
		U = static_cast<CCEXPMat<T>*>(obj.M[obj.M.size()-1].get());
	}

	int ret = U->Initialize(loadName, loadType, MaxRows, &obj);
	CECS_ERR(CCEXPECS,ret != 0,"[%s]: LoadTable():: Internal error occured while copying Table [%s] from an opened file!", obj.SavingFile, name);
	// Copy data from file to the new table.
	MVECTOR<uint64_t> DPL; DPL.resize(N);
	fread(DPL.data(), sizeof(uint64_t), N, lfp);
	MVECTOR<T> rowData;
	uint64_t maxCols=0;
	for (uint64_t row = 0; row < N; row++) {
		const uint64_t columns = DPL[row];
		if (columns > maxCols) { maxCols = columns; rowData.resize(maxCols); }
		fread(rowData.data(), sizeof(T), columns, lfp);
		ret = U->AddRow(rowData.data(), columns);
		CECS_ERR(CCEXPECS,ret != 0,"[%s]: LoadTable():: Internal error occured while copying Table's [%s], row [" __ZU__ "] from an opened file!", obj.SavingFile, name, (size_t)row);
	}
	// Warning: newRowFlag should be set to false, thus use to be able
	// add data directly to the end of the last row if he want.
	U->NoNewRow();

	if (obj.LoadTableIndex >= obj.LoadTotalTables) {
		obj.LoadTableIndex = 0;
		fseek(lfp, sizeof(uint32_t) + sizeof(uint64_t), SEEK_SET);
	}

	obj.Status = CCEXPORTMAT_READY;
}